

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<std::pair<unsigned_int,_unsigned_int>_>
metaf::fractionStrToUint(string *str,size_t startPos,size_t length)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string *str_00;
  size_t startPos_00;
  optional<std::pair<unsigned_int,_unsigned_int>_> *this;
  uint *__b;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long in_RSI;
  char in_DIL;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar5;
  undefined1 auVar6 [16];
  optional<unsigned_int> denominator;
  optional<unsigned_int> numerator;
  size_t denominatorLength;
  size_t denominatorPos;
  size_t numeratorLength;
  size_t numeratorPos;
  size_type slashPos;
  size_t endPos;
  optional<std::pair<unsigned_int,_unsigned_int>_> error;
  pair<unsigned_int,_unsigned_int> *in_stack_ffffffffffffff58;
  pair<unsigned_int,_unsigned_int> local_80;
  _Optional_payload_base<unsigned_int> local_78;
  _Optional_payload_base<unsigned_int> local_70;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> local_34;
  undefined1 local_2c;
  long local_28;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> local_c;
  undefined1 local_4;
  
  std::optional<std::pair<unsigned_int,_unsigned_int>_>::optional
            ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x245559);
  uVar2 = std::__cxx11::string::length();
  local_28 = in_RDX;
  if (uVar2 < (ulong)(in_RDX + in_RSI)) {
    local_28 = std::__cxx11::string::length();
    local_28 = local_28 - in_RSI;
  }
  auVar6 = std::__cxx11::string::find(in_DIL,0x2f);
  uVar4 = auVar6._8_8_;
  lVar3 = auVar6._0_8_;
  if (lVar3 == -1) {
    local_c = local_34;
  }
  else {
    str_00 = (string *)(lVar3 - in_RSI);
    if ((str_00 == (string *)0x0) || ((string *)0x2 < str_00)) {
      local_c = local_34;
    }
    else {
      startPos_00 = lVar3 + 1;
      uVar2 = (in_RSI + local_28) - startPos_00;
      if ((uVar2 == 0) || (2 < uVar2)) {
        local_c = local_34;
      }
      else {
        local_70 = (_Optional_payload_base<unsigned_int>)strToUint(str_00,startPos_00,uVar2);
        local_78 = (_Optional_payload_base<unsigned_int>)strToUint(str_00,startPos_00,uVar2);
        bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x2456d6);
        uVar4 = extraout_RDX;
        if ((bVar1) &&
           (bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x2456e6),
           uVar4 = extraout_RDX_00, bVar1)) {
          this = (optional<std::pair<unsigned_int,_unsigned_int>_> *)
                 std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24570e);
          __b = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x24571d);
          std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                    (&local_80,(uint *)this,__b);
          std::optional<std::pair<unsigned_int,_unsigned_int>_>::
          optional<std::pair<unsigned_int,_unsigned_int>,_true>(this,in_stack_ffffffffffffff58);
          uVar4 = extraout_RDX_01;
          local_2c = local_4;
        }
        else {
          local_c = local_34;
        }
      }
    }
  }
  oVar5.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar4 >> 8),local_2c);
  oVar5.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload = local_c;
  return (optional<std::pair<unsigned_int,_unsigned_int>_>)
         oVar5.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>;
}

Assistant:

std::optional<std::pair<unsigned int, unsigned int> >
	fractionStrToUint(const std::string & str,
		std::size_t startPos,
		std::size_t length)
{
	//Equivalent regex "(\\d\\d?)/(\\d\\d?)"
	std::optional<std::pair<unsigned int, unsigned int> > error;
	if (length + startPos > str.length()) length = str.length() - startPos;
	const std::size_t endPos = startPos + length;

	const auto slashPos = str.find('/', startPos);
	if (slashPos == std::string::npos) return error;

	static const int minDigits = 1, maxDigits = 2;

	const std::size_t numeratorPos = startPos;
	const std::size_t numeratorLength = slashPos - startPos;
	if (numeratorLength < minDigits || numeratorLength > maxDigits) return error;
	const std::size_t denominatorPos = slashPos + 1;
	const std::size_t denominatorLength = endPos - denominatorPos;
	if (denominatorLength < minDigits || denominatorLength > maxDigits) return error;

	const auto numerator = strToUint(str, numeratorPos, numeratorLength);
	const auto denominator = strToUint(str, denominatorPos, denominatorLength);
	if (!numerator.has_value() || !denominator.has_value()) return error;
	return std::pair(*numerator, *denominator);
}